

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

void __thiscall
tchecker::parsing::system::parser_t::basic_symbol<tchecker::parsing::system::parser_t::by_state>::
clear(basic_symbol<tchecker::parsing::system::parser_t::by_state> *this)

{
  symbol_kind_type sVar1;
  basic_symbol<tchecker::parsing::system::parser_t::by_state> *yysym;
  symbol_kind_type yykind;
  basic_symbol<tchecker::parsing::system::parser_t::by_state> *this_local;
  
  sVar1 = by_state::kind(&this->super_by_state);
  switch(sVar1) {
  case S_TOK_ID:
  case S_TOK_INTEGER:
  case S_TOK_TEXT:
  case S_text_or_empty:
    value_type::destroy<std::__cxx11::string>(&this->value);
    break;
  default:
    break;
  case S_attr_list:
  case S_non_empty_attr_list:
    value_type::destroy<tchecker::parsing::attributes_t>(&this->value);
    break;
  case S_attr:
    value_type::destroy<std::shared_ptr<tchecker::parsing::attr_t>>(&this->value);
    break;
  case S_sync_constraint_list:
    value_type::
    destroy<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
              (&this->value);
    break;
  case S_sync_constraint:
    value_type::destroy<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(&this->value);
    break;
  case S_sync_strength:
    value_type::destroy<tchecker::sync_strength_t>(&this->value);
    break;
  case S_integer:
    value_type::destroy<int>(&this->value);
    break;
  case S_uinteger:
    value_type::destroy<unsigned_int>(&this->value);
  }
  by_state::clear(&this->super_by_state);
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_sync_strength: // sync_strength
        value.template destroy< enum tchecker::sync_strength_t > ();
        break;

      case symbol_kind::S_attr: // attr
        value.template destroy< std::shared_ptr<tchecker::parsing::attr_t> > ();
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
        value.template destroy< std::shared_ptr<tchecker::parsing::sync_constraint_t> > ();
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer value"
      case symbol_kind::S_TOK_TEXT: // "text value"
      case symbol_kind::S_text_or_empty: // text_or_empty
        value.template destroy< std::string > ();
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
        value.template destroy< std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ();
        break;

      case symbol_kind::S_integer: // integer
        value.template destroy< tchecker::integer_t > ();
        break;

      case symbol_kind::S_attr_list: // attr_list
      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
        value.template destroy< tchecker::parsing::attributes_t > ();
        break;

      case symbol_kind::S_uinteger: // uinteger
        value.template destroy< unsigned int > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }